

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::JsRTCallFunctionAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  uint uVar1;
  ThreadContext *pTVar2;
  Type ppvVar3;
  int64 topLevelCallbackEventTime;
  ExecutionInfoManager *this;
  int64 topLevelCallbackEventTime_00;
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  ScriptContext *scriptContext;
  RecyclableObject *pRVar7;
  RecyclableObject *value;
  undefined1 *aValue;
  Var pvVar8;
  undefined4 *puVar9;
  ulong uVar10;
  Type TVar11;
  Arguments local_a8;
  Arguments local_98;
  TTDebuggerSourceLocation lastLocation;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  if (evt->EventKind != CallExistingFunctionActionTag) {
    TTDAbort_unrecoverable_error("Bad tag match!");
  }
  pTVar2 = scriptContext->threadContext;
  pRVar7 = (RecyclableObject *)InflateVarInReplay(executeContext,(TTDVar)**(undefined8 **)(evt + 2))
  ;
  if (((ulong)pRVar7 >> 0x30 == 0 && pRVar7 != (RecyclableObject *)0x0) &&
     (bVar5 = Js::VarIsImpl<Js::JavascriptFunction>(pRVar7), bVar5)) {
    value = Js::VarTo<Js::RecyclableObject>(pRVar7);
    if ((((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
        ptr != scriptContext) {
      pRVar7 = (RecyclableObject *)Js::CrossSite::MarshalVar(scriptContext,value,false);
    }
    lastLocation._56_8_ = Js::VarTo<Js::JavascriptFunction>(pRVar7);
    uVar1 = *(uint *)((long)&evt[1].EventTimeStamp + 4);
    if (1 < uVar1) {
      uVar10 = 1;
      do {
        aValue = (undefined1 *)
                 InflateVarInReplay(executeContext,*(TTDVar *)(*(long *)(evt + 2) + uVar10 * 8));
        if (aValue == (undefined1 *)0x0) {
          return;
        }
        if ((aValue < &DAT_1000000000000) &&
           (pRVar7 = Js::VarTo<Js::RecyclableObject>(aValue),
           (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr != scriptContext)) {
          aValue = (undefined1 *)Js::CrossSite::MarshalVar(scriptContext,pRVar7,false);
        }
        *(undefined1 **)(*(long *)(evt[3].EventTimeStamp + 8) + -8 + uVar10 * 8) = aValue;
        uVar10 = uVar10 + 1;
      } while (uVar10 < *(uint *)((long)&evt[1].EventTimeStamp + 4));
    }
    TVar11._0_4_ = uVar1 - 1 & 0xffff;
    TVar11._4_4_ = 0;
    ppvVar3 = *(Type *)(evt[3].EventTimeStamp + 8);
    if ((int)evt[1].EventTimeStamp == 0) {
      topLevelCallbackEventTime._0_4_ = evt[3].EventKind;
      topLevelCallbackEventTime._4_4_ = evt[3].ResultStatus;
      EventLog::ResetCallStackForTopLevelCall(pTVar2->TTDLog,topLevelCallbackEventTime);
      this = pTVar2->TTDExecutionInfo;
      if (this != (ExecutionInfoManager *)0x0) {
        topLevelCallbackEventTime_00._0_4_ = evt[3].EventKind;
        topLevelCallbackEventTime_00._4_4_ = evt[3].ResultStatus;
        ExecutionInfoManager::ResetCallStackForTopLevelCall(this,topLevelCallbackEventTime_00);
      }
      local_98.Info = TVar11;
      local_98.Values = ppvVar3;
      pvVar8 = Js::JavascriptFunction::CallRootFunction
                         ((JavascriptFunction *)lastLocation._56_8_,&local_98,scriptContext,true);
      JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTCallFunctionAction,(TTD::NSLogEvents::EventKind)68>
                (executeContext,evt,pvVar8);
      bVar5 = EventCompletesNormally(evt);
      if (!bVar5) {
        TTDAbort_unrecoverable_error("Why did we get a different completion");
      }
    }
    else {
      local_a8.Info = TVar11;
      local_a8.Values = ppvVar3;
      pvVar8 = Js::JavascriptFunction::CallRootFunction
                         ((JavascriptFunction *)lastLocation._56_8_,&local_a8,scriptContext,true);
      if ((pvVar8 != (Var)0x0) &&
         (BVar6 = Js::CrossSite::NeedMarshalVar(pvVar8,scriptContext), BVar6 != 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTActionEvents.cpp"
                           ,0x475,
                           "(result == nullptr || !Js::CrossSite::NeedMarshalVar(result, ctx))",
                           "result == nullptr || !Js::CrossSite::NeedMarshalVar(result, ctx)");
        if (!bVar5) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar9 = 0;
      }
      JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTCallFunctionAction,(TTD::NSLogEvents::EventKind)68>
                (executeContext,evt,pvVar8);
      bVar5 = EventCompletesNormally(evt);
      if (!bVar5) {
        TTDAbort_unrecoverable_error("Why did we get a different completion");
      }
    }
  }
  return;
}

Assistant:

void JsRTCallFunctionAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);

            const JsRTCallFunctionAction* cfAction = GetInlineEventDataAs<JsRTCallFunctionAction, EventKind::CallExistingFunctionActionTag>(evt);

            ThreadContext* threadContext = ctx->GetThreadContext();

            Js::Var jsFunctionVar = InflateVarInReplay(executeContext, cfAction->ArgArray[0]);
            TTD_REPLAY_VALIDATE_INCOMING_FUNCTION(jsFunctionVar, ctx);

            Js::JavascriptFunction *jsFunction = Js::VarTo<Js::JavascriptFunction>(jsFunctionVar);

            //remove implicit constructor function as first arg in callInfo and argument loop below
            Js::CallInfo callInfo((ushort)(cfAction->ArgCount - 1));
            for(uint32 i = 1; i < cfAction->ArgCount; ++i)
            {
                 Js::Var argi = InflateVarInReplay(executeContext, cfAction->ArgArray[i]);
                 TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(argi, ctx);

                 cfAction->AdditionalReplayInfo->ExecArgs[i - 1] = argi;
            }
            Js::Arguments jsArgs(callInfo, cfAction->AdditionalReplayInfo->ExecArgs);

            //If this isn't a root function then just call it -- don't need to reset anything and exceptions can just continue
            if(cfAction->CallbackDepth != 0)
            {
                Js::Var result = jsFunction->CallRootFunction(jsArgs, ctx, true);
                if(result != nullptr)
                {
                    Assert(result == nullptr || !Js::CrossSite::NeedMarshalVar(result, ctx));
                }

                //since we tag in JsRT we need to tag here too
                JsRTActionHandleResultForReplay<JsRTCallFunctionAction, EventKind::CallExistingFunctionActionTag>(executeContext, evt, result);

                TTDAssert(NSLogEvents::EventCompletesNormally(evt), "Why did we get a different completion");
            }
            else
            {
                threadContext->TTDLog->ResetCallStackForTopLevelCall(cfAction->TopLevelCallbackEventTime);
                if(threadContext->TTDExecutionInfo != nullptr)
                {
                    threadContext->TTDExecutionInfo->ResetCallStackForTopLevelCall(cfAction->TopLevelCallbackEventTime);
                }

                try
                {
                    Js::Var result = jsFunction->CallRootFunction(jsArgs, ctx, true);

                    //since we tag in JsRT we need to tag here too
                    JsRTActionHandleResultForReplay<JsRTCallFunctionAction, EventKind::CallExistingFunctionActionTag>(executeContext, evt, result);

                    TTDAssert(NSLogEvents::EventCompletesNormally(evt), "Why did we get a different completion");
                }
                catch(const Js::JavascriptException& err)
                {
                    TTDAssert(NSLogEvents::EventCompletesWithException(evt), "Why did we get a different exception");

                    if(executeContext->GetActiveScriptContext()->ShouldPerformReplayDebuggerAction())
                    {
                        //convert to uncaught debugger exception for host
                        TTDebuggerSourceLocation lastLocation;
                        threadContext->TTDExecutionInfo->GetLastExecutedTimeAndPositionForDebugger(lastLocation);
                        JsRTCallFunctionAction_SetLastExecutedStatementAndFrameInfo(const_cast<EventLogEntry*>(evt), lastLocation);

                        err.GetAndClear();  // discard exception object

                        //Reset any step controller logic
                        if(ctx->GetThreadContext()->GetDebugManager() != nullptr)
                        {
                            ctx->GetThreadContext()->GetDebugManager()->stepController.Deactivate();
                        }

                        throw TTDebuggerAbortException::CreateUncaughtExceptionAbortRequest(lastLocation.GetRootEventTime(), _u("Uncaught JavaScript exception -- Propagate to top-level."));
                    }

                    throw;
                }
                catch(Js::ScriptAbortException)
                {
                    TTDAssert(NSLogEvents::EventCompletesWithException(evt), "Why did we get a different exception");

                    if(executeContext->GetActiveScriptContext()->ShouldPerformReplayDebuggerAction())
                    {
                        //convert to uncaught debugger exception for host
                        TTDebuggerSourceLocation lastLocation;
                        threadContext->TTDExecutionInfo->GetLastExecutedTimeAndPositionForDebugger(lastLocation);
                        JsRTCallFunctionAction_SetLastExecutedStatementAndFrameInfo(const_cast<EventLogEntry*>(evt), lastLocation);

                        throw TTDebuggerAbortException::CreateUncaughtExceptionAbortRequest(lastLocation.GetRootEventTime(), _u("Uncaught Script exception -- Propagate to top-level."));
                    }
                    else
                    {
                        throw;
                    }
                }
                catch(...)
                {
                    if(executeContext->GetActiveScriptContext()->ShouldPerformReplayDebuggerAction())
                    {
                        TTDebuggerSourceLocation lastLocation;
                        threadContext->TTDExecutionInfo->GetLastExecutedTimeAndPositionForDebugger(lastLocation);
                        JsRTCallFunctionAction_SetLastExecutedStatementAndFrameInfo(const_cast<EventLogEntry*>(evt), lastLocation);
                    }

                    throw;
                }
            }
        }